

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adj_matrix_graph.c
# Opt level: O0

MatrixGraph newEmptyMatrixGraph(int countOfVertex,int countOfEdge)

{
  MatrixGraph pAVar1;
  VertexType *pVVar2;
  int **ppiVar3;
  int *piVar4;
  int local_24;
  int local_20;
  int j;
  int i_1;
  int i;
  MatrixGraph matrixGraph;
  int countOfEdge_local;
  int countOfVertex_local;
  
  pAVar1 = (MatrixGraph)malloc(0x20);
  if (pAVar1 == (MatrixGraph)0x0) {
    __assert_fail("matrixGraph",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/adj_matrix_graph.c"
                  ,0x3c,"MatrixGraph newEmptyMatrixGraph(int, int)");
  }
  pVVar2 = (VertexType *)malloc((long)countOfVertex);
  pAVar1->vertex = pVVar2;
  ppiVar3 = (int **)malloc((long)countOfVertex << 3);
  pAVar1->matrix = ppiVar3;
  if (pAVar1->matrix != (int **)0x0) {
    j = 0;
    while( true ) {
      if (countOfVertex <= j) {
        pAVar1->vexNum = countOfVertex;
        pAVar1->edgeNum = countOfEdge;
        for (local_20 = 0; local_20 < countOfVertex; local_20 = local_20 + 1) {
          for (local_24 = 0; local_24 < countOfVertex; local_24 = local_24 + 1) {
            pAVar1->matrix[local_20][local_24] = 0x7fff;
          }
        }
        return pAVar1;
      }
      piVar4 = (int *)malloc((long)countOfVertex << 2);
      pAVar1->matrix[j] = piVar4;
      if (pAVar1->matrix[j] == (int *)0x0) break;
      j = j + 1;
    }
    __assert_fail("matrixGraph->matrix[i]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/adj_matrix_graph.c"
                  ,0x43,"MatrixGraph newEmptyMatrixGraph(int, int)");
  }
  __assert_fail("matrixGraph->matrix",
                "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/adj_matrix_graph.c"
                ,0x40,"MatrixGraph newEmptyMatrixGraph(int, int)");
}

Assistant:

MatrixGraph newEmptyMatrixGraph(int countOfVertex, int countOfEdge) {
    MatrixGraph matrixGraph = malloc(sizeof(struct AMG));
    assert(matrixGraph);

    matrixGraph->vertex = malloc(sizeof(VertexType) * countOfVertex);
    matrixGraph->matrix = malloc(sizeof(int *) * countOfVertex);
    assert(matrixGraph->matrix);
    for (int i = 0; i < countOfVertex; ++i) {
        matrixGraph->matrix[i] = malloc(sizeof(int) * countOfVertex);
        assert(matrixGraph->matrix[i]);
    }


    matrixGraph->vexNum = countOfVertex;
    matrixGraph->edgeNum = countOfEdge;

    // 初始化矩阵
    for (int i = 0; i < countOfVertex; ++i) {
        for (int j = 0; j < countOfVertex; ++j) {
            matrixGraph->matrix[i][j] = UNFLAG_WEIGHT_GRAPH;
        }
    }

    return matrixGraph;
}